

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_1::WatWriter::FlushExprTreeVector
          (WatWriter *this,
          vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
          *expr_trees)

{
  ExprType EVar1;
  pointer pEVar2;
  pointer pCVar3;
  Expr *base;
  bool bVar4;
  BlockExprBase<(wabt::ExprType)8> *pBVar5;
  char *pcVar6;
  BlockExprBase<(wabt::ExprType)27> *pBVar7;
  IfExpr *pIVar8;
  TryExpr *pTVar9;
  Catch *catch_;
  pointer this_00;
  pointer pEVar10;
  ExprVisitorDelegate delegate;
  ExprTree expr_tree;
  ExprVisitor local_98;
  
  pEVar10 = (expr_trees->
            super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pEVar2 = (expr_trees->
           super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pEVar10 == pEVar2) {
      return;
    }
    ExprTree::ExprTree(&expr_tree,pEVar10);
    base = expr_tree.expr;
    EVar1 = (expr_tree.expr)->type_;
    if (EVar1 == Try) {
      pTVar9 = cast<wabt::TryExpr,wabt::Expr>(expr_tree.expr);
      WritePuts(this,"(",None);
      pcVar6 = Opcode::GetName((Opcode *)&Opcode::Try_Opcode);
      WriteBeginBlock(this,Try,&pTVar9->block,pcVar6);
      WriteOpenNewline(this,"do");
      FlushExprTreeVector(this,&expr_tree.children);
      WriteFoldedExprList(this,&(pTVar9->block).exprs);
      FlushExprTreeStack(this);
      WriteCloseNewline(this);
      if (pTVar9->kind == Delegate) {
        WritePuts(this,"(",None);
        pcVar6 = Opcode::GetName((Opcode *)&Opcode::Delegate_Opcode);
        WritePutsSpace(this,pcVar6);
        WriteVar(this,&pTVar9->delegate_target,None);
        WritePuts(this,")",Newline);
      }
      else if (pTVar9->kind == Catch) {
        pCVar3 = (pTVar9->catches).super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (this_00 = (pTVar9->catches).
                       super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
                       super__Vector_impl_data._M_start; this_00 != pCVar3; this_00 = this_00 + 1) {
          WritePuts(this,"(",None);
          bVar4 = Catch::IsCatchAll(this_00);
          if (bVar4) {
            WritePutsNewline(this,"catch_all");
          }
          else {
            pcVar6 = Opcode::GetName((Opcode *)&Opcode::Catch_Opcode);
            WritePutsSpace(this,pcVar6);
            WriteVar(this,&this_00->var,Newline);
          }
          this->indent_ = this->indent_ + 2;
          WriteFoldedExprList(this,&this_00->exprs);
          FlushExprTreeStack(this);
          WriteCloseNewline(this);
        }
      }
LAB_0018c9ae:
      WriteCloseNewline(this);
      ModuleContext::EndBlock(&this->super_ModuleContext);
    }
    else {
      if (EVar1 == If) {
        pIVar8 = cast<wabt::IfExpr,wabt::Expr>(expr_tree.expr);
        WritePuts(this,"(",None);
        pcVar6 = Opcode::GetName((Opcode *)&Opcode::If_Opcode);
        WriteBeginBlock(this,If,&pIVar8->true_,pcVar6);
        FlushExprTreeVector(this,&expr_tree.children);
        WriteOpenNewline(this,"then");
        WriteFoldedExprList(this,&(pIVar8->true_).exprs);
        FlushExprTreeStack(this);
        WriteCloseNewline(this);
        if ((pIVar8->false_).size_ != 0) {
          WriteOpenNewline(this,"else");
          WriteFoldedExprList(this,&pIVar8->false_);
          FlushExprTreeStack(this);
          WriteCloseNewline(this);
        }
        goto LAB_0018c9ae;
      }
      if (EVar1 == Loop) {
        WritePuts(this,"(",None);
        pBVar7 = cast<wabt::BlockExprBase<(wabt::ExprType)27>,wabt::Expr>(base);
        pcVar6 = Opcode::GetName((Opcode *)&Opcode::Loop_Opcode);
        WriteBeginBlock(this,Loop,&pBVar7->block,pcVar6);
        pBVar7 = cast<wabt::BlockExprBase<(wabt::ExprType)27>,wabt::Expr>(base);
LAB_0018c997:
        WriteFoldedExprList(this,&(pBVar7->block).exprs);
        FlushExprTreeStack(this);
        goto LAB_0018c9ae;
      }
      if (EVar1 == Block) {
        WritePuts(this,"(",None);
        pBVar5 = cast<wabt::BlockExprBase<(wabt::ExprType)8>,wabt::Expr>(base);
        pcVar6 = Opcode::GetName((Opcode *)&Opcode::Block_Opcode);
        WriteBeginBlock(this,Block,&pBVar5->block,pcVar6);
        pBVar7 = (BlockExprBase<(wabt::ExprType)27> *)
                 cast<wabt::BlockExprBase<(wabt::ExprType)8>,wabt::Expr>(base);
        goto LAB_0018c997;
      }
      WritePuts(this,"(",None);
      delegate.super_Delegate._vptr_Delegate = (_func_int **)&PTR__Delegate_00237c18;
      delegate.writer_ = this;
      ExprVisitor::ExprVisitor(&local_98,&delegate.super_Delegate);
      ExprVisitor::VisitExpr(&local_98,base);
      ExprVisitor::~ExprVisitor(&local_98);
      this->indent_ = this->indent_ + 2;
      FlushExprTreeVector(this,&expr_tree.children);
      WriteCloseNewline(this);
    }
    std::
    vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ::~vector(&expr_tree.children);
    pEVar10 = pEVar10 + 1;
  } while( true );
}

Assistant:

void WatWriter::FlushExprTreeVector(const std::vector<ExprTree>& expr_trees) {
  WABT_TRACE_ARGS(FlushExprTreeVector, "%zu", expr_trees.size());
  for (auto expr_tree : expr_trees) {
    FlushExprTree(expr_tree);
  }
}